

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int langidFromSelect(Fts3Table *p,sqlite3_stmt *pSelect)

{
  int iVar1;
  Mem *pMem;
  i64 iVar2;
  
  if (p->zLanguageid == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    pMem = columnMem(pSelect,p->nColumn + 1);
    iVar2 = sqlite3VdbeIntValue(pMem);
    iVar1 = (int)iVar2;
    columnMallocFailure(pSelect);
  }
  return iVar1;
}

Assistant:

static int langidFromSelect(Fts3Table *p, sqlite3_stmt *pSelect){
  int iLangid = 0;
  if( p->zLanguageid ) iLangid = sqlite3_column_int(pSelect, p->nColumn+1);
  return iLangid;
}